

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int net_tcp_connect(NETSOCKET sock,NETADDR *a)

{
  int iVar1;
  socklen_t __len;
  int __fd;
  long in_FS_OFFSET;
  sockaddr_in addr;
  sockaddr_in6 local_34;
  long local_18;
  
  __fd = sock.ipv6sock;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((a->type & 1) == 0) {
    iVar1 = -1;
    if ((a->type & 2) == 0) goto LAB_00143f32;
    netaddr_to_sockaddr_in6(a,&local_34);
    __len = 0x1c;
  }
  else {
    netaddr_to_sockaddr_in(a,(sockaddr_in *)&local_34);
    __fd = sock.ipv4sock;
    __len = 0x10;
  }
  iVar1 = connect(__fd,(sockaddr *)&local_34,__len);
LAB_00143f32:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int net_tcp_connect(NETSOCKET sock, const NETADDR *a)
{
	if(a->type&NETTYPE_IPV4)
	{
		struct sockaddr_in addr;
		netaddr_to_sockaddr_in(a, &addr);
		return connect(sock.ipv4sock, (struct sockaddr *)&addr, sizeof(addr));
	}

	if(a->type&NETTYPE_IPV6)
	{
		struct sockaddr_in6 addr;
		netaddr_to_sockaddr_in6(a, &addr);
		return connect(sock.ipv6sock, (struct sockaddr *)&addr, sizeof(addr));
	}

	return -1;
}